

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  allocator<char> local_35;
  float local_34;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"numbers.txt",&local_35);
  local_34 = sum(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sum of all numbers in \'");
  poVar1 = std::operator<<(poVar1,"numbers.txt");
  poVar1 = std::operator<<(poVar1,"\' is: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_34);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
	auto file_name = "numbers.txt";
	try
	{
		auto num_sum = sum(file_name);
		std::cout << "Sum of all numbers in '" << file_name << "' is: "
			<< num_sum << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}